

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.h
# Opt level: O2

void llbuild::basic::BinaryCodingTraits<llbuild::basic::FileInfo>::encode
               (FileInfo *value,BinaryEncoder *coder)

{
  size_t in_RCX;
  void *in_RDX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  
  BinaryEncoder::write(coder,(int)value->device,in_RDX,in_RCX);
  BinaryEncoder::write(coder,(int)value->inode,__buf,in_RCX);
  BinaryEncoder::write(coder,(int)value->mode,__buf_00,in_RCX);
  BinaryEncoder::write(coder,(int)value->size,__buf_01,in_RCX);
  BinaryCodingTraits<llbuild::basic::FileTimestamp>::encode(&value->modTime,coder);
  BinaryCodingTraits<llbuild::basic::FileChecksum>::encode(&value->checksum,coder);
  return;
}

Assistant:

static inline void encode(const FileInfo& value, BinaryEncoder& coder) {
    coder.write(value.device);
    coder.write(value.inode);
    coder.write(value.mode);
    coder.write(value.size);
    coder.write(value.modTime);
    coder.write(value.checksum);
  }